

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

ArrayBuilder<kj::Own<capnp::PipelineHook>_> * __thiscall
kj::ArrayBuilder<kj::Own<capnp::PipelineHook>_>::operator=
          (ArrayBuilder<kj::Own<capnp::PipelineHook>_> *this,
          ArrayBuilder<kj::Own<capnp::PipelineHook>_> *other)

{
  ArrayBuilder<kj::Own<capnp::PipelineHook>_> *other_local;
  ArrayBuilder<kj::Own<capnp::PipelineHook>_> *this_local;
  
  dispose(this);
  this->ptr = other->ptr;
  this->pos = other->pos;
  this->endPtr = other->endPtr;
  this->disposer = other->disposer;
  other->ptr = (Own<capnp::PipelineHook> *)0x0;
  other->pos = (RemoveConst<kj::Own<capnp::PipelineHook>_> *)0x0;
  other->endPtr = (Own<capnp::PipelineHook> *)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }